

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * testing::internal::FlagToEnvVar_abi_cxx11_(char *flag)

{
  char cVar1;
  Message *this;
  string *in_RDI;
  size_t i;
  size_type sVar2;
  long in_FS_OFFSET;
  Message env_var;
  string full_flag;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char *local_40;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  Message::Message((Message *)&local_48);
  std::operator<<((ostream *)(local_48.ptr_ + 0x10),"gtest_");
  this = Message::operator<<((Message *)&local_48,&local_40);
  Message::GetString_abi_cxx11_(&local_38,this);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_48);
  Message::Message((Message *)&local_48);
  for (sVar2 = 0; sVar2 != local_38._M_string_length; sVar2 = sVar2 + 1) {
    cVar1 = ToUpper(local_38._M_dataplus._M_p[sVar2]);
    std::operator<<((ostream *)(local_48.ptr_ + 0x10),cVar1);
  }
  StringStreamToString(in_RDI,local_48.ptr_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_48);
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}